

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_JPEG_Image.cxx
# Opt level: O0

void __thiscall Fl_JPEG_Image::Fl_JPEG_Image(Fl_JPEG_Image *this,char *name,uchar *data)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__ptr;
  char *__ptr_00;
  size_t sVar5;
  uchar *puVar6;
  Fl_Shared_Image *this_00;
  Fl_Shared_Image *si;
  char *max_destroy_decompress_err;
  char *max_finish_decompress_err;
  JSAMPROW row;
  fl_jpeg_error_mgr jerr;
  jpeg_decompress_struct dinfo;
  uchar *data_local;
  char *name_local;
  Fl_JPEG_Image *this_local;
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_JPEG_Image_002efb18;
  (this->super_Fl_RGB_Image).alloc_array = 0;
  (this->super_Fl_RGB_Image).array = (uchar *)0x0;
  jerr.errhand_[0].__saved_mask.__val[0xf] = jpeg_std_error(&row);
  row = (JSAMPROW)fl_jpeg_error_handler;
  jerr.pub_.emit_message = fl_jpeg_output_handler;
  __ptr = (char *)malloc(1);
  __ptr_00 = (char *)malloc(1);
  *__ptr = '\n';
  *__ptr_00 = '\n';
  iVar2 = _setjmp((__jmp_buf_tag *)&jerr.pub_.first_addon_message);
  if (iVar2 == 0) {
    jpeg_CreateDecompress(jerr.errhand_[0].__saved_mask.__val + 0xf,0x50,0x290);
    jpeg_mem_src((j_decompress_ptr)(jerr.errhand_[0].__saved_mask.__val + 0xf),data);
    jpeg_read_header(jerr.errhand_[0].__saved_mask.__val + 0xf,1);
    jpeg_calc_output_dimensions(jerr.errhand_[0].__saved_mask.__val + 0xf);
    Fl_Image::w((Fl_Image *)this,dinfo.enable_external_quant);
    Fl_Image::h((Fl_Image *)this,dinfo.enable_2pass_quant);
    Fl_Image::d((Fl_Image *)this,3);
    iVar2 = Fl_Image::w((Fl_Image *)this);
    iVar3 = Fl_Image::h((Fl_Image *)this);
    iVar4 = Fl_Image::d((Fl_Image *)this);
    sVar5 = Fl_RGB_Image::max_size();
    if (sVar5 < (ulong)((long)iVar2 * (long)iVar3 * (long)iVar4)) {
      longjmp((__jmp_buf_tag *)&jerr.pub_.first_addon_message,1);
    }
    iVar2 = Fl_Image::w((Fl_Image *)this);
    iVar3 = Fl_Image::h((Fl_Image *)this);
    iVar4 = Fl_Image::d((Fl_Image *)this);
    puVar6 = (uchar *)operator_new__((long)(iVar2 * iVar3 * iVar4));
    (this->super_Fl_RGB_Image).array = puVar6;
    (this->super_Fl_RGB_Image).alloc_array = 1;
    jpeg_start_decompress(jerr.errhand_[0].__saved_mask.__val + 0xf);
    while ((uint)dinfo.colormap < (uint)dinfo.enable_2pass_quant) {
      max_finish_decompress_err =
           (char *)((this->super_Fl_RGB_Image).array +
                   (uint)dinfo.colormap * dinfo.enable_external_quant * 3);
      jpeg_read_scanlines(jerr.errhand_[0].__saved_mask.__val + 0xf,&max_finish_decompress_err,1);
    }
    jpeg_finish_decompress(jerr.errhand_[0].__saved_mask.__val + 0xf);
    jpeg_destroy_decompress(jerr.errhand_[0].__saved_mask.__val + 0xf);
    free(__ptr_00);
    free(__ptr);
    iVar2 = Fl_Image::w((Fl_Image *)this);
    if (iVar2 != 0) {
      iVar2 = Fl_Image::h((Fl_Image *)this);
      if ((iVar2 != 0) && (name != (char *)0x0)) {
        this_00 = (Fl_Shared_Image *)operator_new(0x48);
        Fl_Shared_Image::Fl_Shared_Image(this_00,name,(Fl_Image *)this);
        Fl_Shared_Image::add(this_00);
      }
    }
  }
  else {
    (*Fl::warning)("JPEG data is too large or contains errors!\n");
    cVar1 = *__ptr;
    *__ptr = cVar1 + -1;
    if (('\0' < cVar1) && ((this->super_Fl_RGB_Image).array != (uchar *)0x0)) {
      jpeg_finish_decompress(jerr.errhand_[0].__saved_mask.__val + 0xf);
    }
    cVar1 = *__ptr_00;
    *__ptr_00 = cVar1 + -1;
    if ('\0' < cVar1) {
      jpeg_destroy_decompress(jerr.errhand_[0].__saved_mask.__val + 0xf);
    }
    Fl_Image::w((Fl_Image *)this,0);
    Fl_Image::h((Fl_Image *)this,0);
    Fl_Image::d((Fl_Image *)this,0);
    if ((this->super_Fl_RGB_Image).array != (uchar *)0x0) {
      puVar6 = (this->super_Fl_RGB_Image).array;
      if (puVar6 != (uchar *)0x0) {
        operator_delete__(puVar6);
      }
      (this->super_Fl_RGB_Image).array = (uchar *)0x0;
      (this->super_Fl_RGB_Image).alloc_array = 0;
    }
    free(__ptr_00);
    free(__ptr);
  }
  return;
}

Assistant:

Fl_JPEG_Image::Fl_JPEG_Image(const char *name, const unsigned char *data)
: Fl_RGB_Image(0,0,0) {
#ifdef HAVE_LIBJPEG
  jpeg_decompress_struct	dinfo;	// Decompressor info
  fl_jpeg_error_mgr		jerr;	// Error handler info
  JSAMPROW			row;	// Sample row pointer
  
  // the following variables are pointers allocating some private space that
  // is not reset by 'setjmp()'
  char* max_finish_decompress_err;      // count errors and give up afer a while
  char* max_destroy_decompress_err;     // to avoid recusion and deadlock
  
  // Clear data...
  alloc_array = 0;
  array = (uchar *)0;
  
  // Setup the decompressor info and read the header...
  dinfo.err                = jpeg_std_error((jpeg_error_mgr *)&jerr);
  jerr.pub_.error_exit     = fl_jpeg_error_handler;
  jerr.pub_.output_message = fl_jpeg_output_handler;
  
  // Setup error loop variables
  max_finish_decompress_err = (char*)malloc(1);   // allocate space on the frame for error counters
  max_destroy_decompress_err = (char*)malloc(1);  // otherwise, the variables are reset on the longjmp
  *max_finish_decompress_err=10;
  *max_destroy_decompress_err=10;
  
  if (setjmp(jerr.errhand_))
  {
    // JPEG error handling...
    Fl::warning("JPEG data is too large or contains errors!\n");
    // if any of the cleanup routines hits another error, we would end up 
    // in a loop. So instead, we decrement max_err for some upper cleanup limit.
    if ( ((*max_finish_decompress_err)-- > 0) && array)
      jpeg_finish_decompress(&dinfo);
    if ( (*max_destroy_decompress_err)-- > 0)
      jpeg_destroy_decompress(&dinfo);
    
    w(0);
    h(0);
    d(0);
    
    if (array) {
      delete[] (uchar *)array;
      array = 0;
      alloc_array = 0;
    }
    
    free(max_destroy_decompress_err);
    free(max_finish_decompress_err);
    
    return;
  }
  
  jpeg_create_decompress(&dinfo);
  jpeg_mem_src(&dinfo, data);
  jpeg_read_header(&dinfo, TRUE);
  
  dinfo.quantize_colors      = (boolean)FALSE;
  dinfo.out_color_space      = JCS_RGB;
  dinfo.out_color_components = 3;
  dinfo.output_components    = 3;
  
  jpeg_calc_output_dimensions(&dinfo);
  
  w(dinfo.output_width); 
  h(dinfo.output_height);
  d(dinfo.output_components);
  
  if (((size_t)w()) * h() * d() > max_size() ) longjmp(jerr.errhand_, 1);
  array = new uchar[w() * h() * d()];
  alloc_array = 1;
  
  jpeg_start_decompress(&dinfo);
  
  while (dinfo.output_scanline < dinfo.output_height) {
    row = (JSAMPROW)(array +
                     dinfo.output_scanline * dinfo.output_width *
                     dinfo.output_components);
    jpeg_read_scanlines(&dinfo, &row, (JDIMENSION)1);
  }
  
  jpeg_finish_decompress(&dinfo);
  jpeg_destroy_decompress(&dinfo);
  
  free(max_destroy_decompress_err);
  free(max_finish_decompress_err);

  if (w() && h() && name) {
    Fl_Shared_Image *si = new Fl_Shared_Image(name, this);
    si->add();
  }
#endif // HAVE_LIBJPEG
}